

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_seq_parameter_set_svc_extension(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *psVar1;
  uint32_t uVar2;
  uint uVar3;
  FILE *pFVar4;
  
  psVar1 = (sps_subset->field_1).sps_svc_ext;
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->inter_layer_deblocking_filter_control_present_flag = SUB41(uVar2,0);
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n",
          (ulong)uVar2);
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u(b,2);
  psVar1->extended_spatial_scalability_idc = (uchar)uVar2;
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"sps_svc_ext->extended_spatial_scalability_idc: %d \n",(ulong)(uVar2 & 0xff));
  if (sps_subset->sps->chroma_format_idc - 1U < 2) {
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = bs_read_u1(b);
    psVar1->chroma_phase_x_plus1_flag = SUB41(uVar2,0);
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->chroma_phase_x_plus1_flag: %d \n",(ulong)uVar2);
    if (sps_subset->sps->chroma_format_idc == 1) {
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u(b,2);
      psVar1->chroma_phase_y_plus1 = (uchar)uVar2;
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"sps_svc_ext->chroma_phase_y_plus1: %d \n",(ulong)(uVar2 & 0xff));
    }
  }
  if (psVar1->extended_spatial_scalability_idc != '\0') {
    if (0 < sps_subset->sps->chroma_format_idc) {
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u1(b);
      psVar1->seq_ref_layer_chroma_phase_x_plus1_flag = SUB41(uVar2,0);
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n",(ulong)uVar2);
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u(b,2);
      psVar1->seq_ref_layer_chroma_phase_y_plus1 = (uchar)uVar2;
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n",(ulong)(uVar2 & 0xff))
      ;
    }
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_left_offset = uVar3;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n",(ulong)uVar3);
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_top_offset = uVar3;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n",(ulong)uVar3);
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_right_offset = uVar3;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n",(ulong)uVar3);
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_bottom_offset = uVar3;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n",(ulong)uVar3);
  }
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->seq_tcoeff_level_prediction_flag = SUB41(uVar2,0);
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n",(ulong)uVar2);
  if (psVar1->seq_tcoeff_level_prediction_flag == true) {
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = bs_read_u1(b);
    psVar1->adaptive_tcoeff_level_prediction_flag = SUB41(uVar2,0);
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n",(ulong)uVar2);
  }
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->slice_header_restriction_flag = SUB41(uVar2,0);
  pFVar4 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar4 = _stdout;
  }
  fprintf(pFVar4,"sps_svc_ext->slice_header_restriction_flag: %d \n",(ulong)uVar2);
  return;
}

Assistant:

void read_debug_seq_parameter_set_svc_extension(sps_subset_t* sps_subset, bs_t* b)
{
    sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->inter_layer_deblocking_filter_control_present_flag = bs_read_u1(b); printf("sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n", sps_svc_ext->inter_layer_deblocking_filter_control_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->extended_spatial_scalability_idc = bs_read_u(b, 2); printf("sps_svc_ext->extended_spatial_scalability_idc: %d \n", sps_svc_ext->extended_spatial_scalability_idc); 
    if( sps_subset->sps->chroma_format_idc == 1 || sps_subset->sps->chroma_format_idc == 2 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->chroma_phase_x_plus1_flag); 
    }
    if( sps_subset->sps->chroma_format_idc == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->chroma_phase_y_plus1: %d \n", sps_svc_ext->chroma_phase_y_plus1); 
    }
    if( sps_svc_ext->extended_spatial_scalability_idc )
    {
        if( sps_subset->sps->chroma_format_idc > 0 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_left_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_top_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_right_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_bottom_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->seq_tcoeff_level_prediction_flag); 
    if( sps_svc_ext->seq_tcoeff_level_prediction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->adaptive_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->adaptive_tcoeff_level_prediction_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->slice_header_restriction_flag = bs_read_u1(b); printf("sps_svc_ext->slice_header_restriction_flag: %d \n", sps_svc_ext->slice_header_restriction_flag); 
}